

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQOptimizer::Jump,_unsigned_int>::resize
          (sqvector<SQOptimizer::Jump,_unsigned_int> *this,size_type newsize,Jump *fill)

{
  undefined8 *puVar1;
  undefined8 *in_RDX;
  uint in_ESI;
  long *in_RDI;
  size_type i;
  uint local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(uint *)((long)in_RDI + 0x14) < in_ESI) {
    _realloc((sqvector<SQOptimizer::Jump,_unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0)
             ,(size_type)((ulong)in_RDX >> 0x20));
  }
  local_1c = in_ESI;
  if (*(uint *)(in_RDI + 2) < in_ESI) {
    while (*(uint *)(in_RDI + 2) < in_ESI) {
      puVar1 = (undefined8 *)(*in_RDI + (ulong)*(uint *)(in_RDI + 2) * 0x14);
      *puVar1 = *in_RDX;
      puVar1[1] = in_RDX[1];
      *(undefined4 *)(puVar1 + 2) = *(undefined4 *)(in_RDX + 2);
      *(int *)(in_RDI + 2) = (int)in_RDI[2] + 1;
    }
  }
  else {
    for (; local_1c < *(uint *)(in_RDI + 2); local_1c = local_1c + 1) {
    }
    *(uint *)(in_RDI + 2) = in_ESI;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }